

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

string * NJamSpell::DumpKey<unsigned_int>(string *__return_storage_ptr__,uint *key)

{
  ostream local_190 [8];
  ostream out;
  stringbuf local_80 [8];
  stringbuf buf;
  uint *key_local;
  
  std::__cxx11::stringbuf::stringbuf(local_80);
  std::ostream::ostream(local_190,(streambuf *)local_80);
  NHandyPack::Dump<unsigned_int>(local_190,key);
  std::__cxx11::stringbuf::str();
  std::ostream::~ostream(local_190);
  std::__cxx11::stringbuf::~stringbuf(local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpKey(const T& key) {
    std::stringbuf buf;
    std::ostream out(&buf);
    NHandyPack::Dump(out, key);
    return buf.str();
}